

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O0

HT_ErrorCode
ht_registry_register_listener_container(char *name,HT_TimelineListenerContainer *container)

{
  uint32_t id;
  HT_TimelineListenerContainer *pHVar1;
  HT_ErrorCode error_code;
  HT_TimelineListenerContainer *container_local;
  char *name_local;
  
  pHVar1 = ht_registry_find_listener_container(name);
  if (pHVar1 == (HT_TimelineListenerContainer *)0x0) {
    ht_mutex_lock(listeners_register_mutex);
    id = djb2_hash(name);
    ht_timeline_listener_container_set_id(container,id);
    ht_timeline_listener_container_ref(container);
    name_local._4_4_ = ht_bag_void_ptr_add(&listeners_register,container);
    if (name_local._4_4_ == HT_ERR_OK) {
      ht_mutex_unlock(listeners_register_mutex);
      name_local._4_4_ = HT_ERR_OK;
    }
    else {
      ht_mutex_unlock(listeners_register_mutex);
    }
  }
  else {
    name_local._4_4_ = HT_ERR_LISTENER_CONTAINER_ALREADY_REGISTERED;
  }
  return name_local._4_4_;
}

Assistant:

HT_ErrorCode
ht_registry_register_listener_container(const char* name, HT_TimelineListenerContainer* container)
{
    HT_ErrorCode error_code;

    if (ht_registry_find_listener_container(name) != NULL)
    {
        return HT_ERR_LISTENER_CONTAINER_ALREADY_REGISTERED;
    }

    ht_mutex_lock(listeners_register_mutex);
    ht_timeline_listener_container_set_id(container, djb2_hash(name));
    ht_timeline_listener_container_ref(container);

    error_code = ht_bag_void_ptr_add(&listeners_register, container);
    if (error_code != HT_ERR_OK)
    {
        ht_mutex_unlock(listeners_register_mutex);
        return error_code;
    }

    ht_mutex_unlock(listeners_register_mutex);

    return HT_ERR_OK;
}